

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O1

void __thiscall mnf::Manifold::setDimension(Manifold *this,Index d)

{
  undefined8 uVar1;
  
  if (((this->super_ValidManifold).flag_ == 0x677d7257) && (-1 < d)) {
    testLock(this);
    this->dimension_ = d;
    return;
  }
  uVar1 = __cxa_allocate_exception(1);
  __cxa_throw(uVar1,&mnf_exception::typeinfo,0);
}

Assistant:

Manifold::~Manifold() {}